

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Acceptor.cpp
# Opt level: O0

Session * __thiscall FIX::Acceptor::getSession(Acceptor *this,string *msg,Responder *responder)

{
  bool bVar1;
  FieldMap *pFVar2;
  string *psVar3;
  string *senderCompID_00;
  string *targetCompID_00;
  pointer ppVar4;
  FieldNotFound *anon_var_0;
  _Self local_568;
  iterator i;
  string local_558;
  undefined1 local_538 [8];
  SessionID sessionID;
  TargetCompID targetCompID;
  SenderCompID senderCompID;
  MsgType msgType;
  TargetCompID clTargetCompID;
  SenderCompID clSenderCompID;
  BeginString beginString;
  undefined1 local_180 [8];
  Message message;
  Responder *responder_local;
  string *msg_local;
  Acceptor *this_local;
  
  message._336_8_ = responder;
  Message::Message((Message *)local_180);
  bVar1 = Message::setStringHeader((Message *)local_180,msg);
  if (bVar1) {
    BeginString::BeginString
              ((BeginString *)&clSenderCompID.super_StringField.super_FieldBase.m_metrics.m_checksum
              );
    SenderCompID::SenderCompID
              ((SenderCompID *)
               &clTargetCompID.super_StringField.super_FieldBase.m_metrics.m_checksum);
    TargetCompID::TargetCompID
              ((TargetCompID *)&msgType.super_StringField.super_FieldBase.m_metrics.m_checksum);
    MsgType::MsgType((MsgType *)&senderCompID.super_StringField.super_FieldBase.m_metrics.m_checksum
                    );
    pFVar2 = &Message::getHeader((Message *)local_180)->super_FieldMap;
    FieldMap::getField(pFVar2,(FieldBase *)
                              &clSenderCompID.super_StringField.super_FieldBase.m_metrics.m_checksum
                      );
    pFVar2 = &Message::getHeader((Message *)local_180)->super_FieldMap;
    FieldMap::getField(pFVar2,(FieldBase *)
                              &clTargetCompID.super_StringField.super_FieldBase.m_metrics.m_checksum
                      );
    pFVar2 = &Message::getHeader((Message *)local_180)->super_FieldMap;
    FieldMap::getField(pFVar2,(FieldBase *)
                              &msgType.super_StringField.super_FieldBase.m_metrics.m_checksum);
    pFVar2 = &Message::getHeader((Message *)local_180)->super_FieldMap;
    FieldMap::getField(pFVar2,(FieldBase *)
                              &senderCompID.super_StringField.super_FieldBase.m_metrics.m_checksum);
    bVar1 = FIX::operator!=((StringField *)
                            &senderCompID.super_StringField.super_FieldBase.m_metrics.m_checksum,"A"
                           );
    if (bVar1) {
      this_local = (Acceptor *)0x0;
    }
    else {
      psVar3 = StringField::operator_cast_to_string_
                         ((StringField *)
                          &msgType.super_StringField.super_FieldBase.m_metrics.m_checksum);
      SenderCompID::SenderCompID
                ((SenderCompID *)
                 &targetCompID.super_StringField.super_FieldBase.m_metrics.m_checksum,psVar3);
      psVar3 = StringField::operator_cast_to_string_
                         ((StringField *)
                          &clTargetCompID.super_StringField.super_FieldBase.m_metrics.m_checksum);
      TargetCompID::TargetCompID
                ((TargetCompID *)((long)&sessionID.m_frozenString.field_2 + 8),psVar3);
      psVar3 = StringField::operator_cast_to_string_
                         ((StringField *)
                          &clSenderCompID.super_StringField.super_FieldBase.m_metrics.m_checksum);
      senderCompID_00 =
           StringField::operator_cast_to_string_
                     ((StringField *)
                      &targetCompID.super_StringField.super_FieldBase.m_metrics.m_checksum);
      targetCompID_00 =
           StringField::operator_cast_to_string_
                     ((StringField *)((long)&sessionID.m_frozenString.field_2 + 8));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_558,"",(allocator<char> *)((long)&i._M_node + 7));
      SessionID::SessionID((SessionID *)local_538,psVar3,senderCompID_00,targetCompID_00,&local_558)
      ;
      std::__cxx11::string::~string((string *)&local_558);
      std::allocator<char>::~allocator((allocator<char> *)((long)&i._M_node + 7));
      local_568._M_node =
           (_Base_ptr)
           std::
           map<FIX::SessionID,_FIX::Session_*,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Session_*>_>_>
           ::find(&this->m_sessions,(key_type *)local_538);
      anon_var_0 = (FieldNotFound *)
                   std::
                   map<FIX::SessionID,_FIX::Session_*,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Session_*>_>_>
                   ::end(&this->m_sessions);
      bVar1 = std::operator!=(&local_568,(_Self *)&anon_var_0);
      if (bVar1) {
        ppVar4 = std::_Rb_tree_iterator<std::pair<const_FIX::SessionID,_FIX::Session_*>_>::
                 operator->(&local_568);
        Session::setResponder(ppVar4->second,(Responder *)message._336_8_);
        ppVar4 = std::_Rb_tree_iterator<std::pair<const_FIX::SessionID,_FIX::Session_*>_>::
                 operator->(&local_568);
        this_local = (Acceptor *)ppVar4->second;
      }
      SessionID::~SessionID((SessionID *)local_538);
      TargetCompID::~TargetCompID((TargetCompID *)((long)&sessionID.m_frozenString.field_2 + 8));
      SenderCompID::~SenderCompID
                ((SenderCompID *)
                 &targetCompID.super_StringField.super_FieldBase.m_metrics.m_checksum);
      if (!bVar1) {
        this_local = (Acceptor *)0x0;
      }
    }
    MsgType::~MsgType((MsgType *)
                      &senderCompID.super_StringField.super_FieldBase.m_metrics.m_checksum);
    TargetCompID::~TargetCompID
              ((TargetCompID *)&msgType.super_StringField.super_FieldBase.m_metrics.m_checksum);
    SenderCompID::~SenderCompID
              ((SenderCompID *)
               &clTargetCompID.super_StringField.super_FieldBase.m_metrics.m_checksum);
    BeginString::~BeginString
              ((BeginString *)&clSenderCompID.super_StringField.super_FieldBase.m_metrics.m_checksum
              );
  }
  else {
    this_local = (Acceptor *)0x0;
  }
  Message::~Message((Message *)local_180);
  return (Session *)this_local;
}

Assistant:

Session* Acceptor::getSession
( const std::string& msg, Responder& responder )
{
  Message message;
  if ( !message.setStringHeader( msg ) )
    return 0;

  BeginString beginString;
  SenderCompID clSenderCompID;
  TargetCompID clTargetCompID;
  MsgType msgType;
  try
  {
    message.getHeader().getField( beginString );
    message.getHeader().getField( clSenderCompID );
    message.getHeader().getField( clTargetCompID );
    message.getHeader().getField( msgType );
    if ( msgType != "A" ) return 0;

    SenderCompID senderCompID( clTargetCompID );
    TargetCompID targetCompID( clSenderCompID );
    SessionID sessionID( beginString, senderCompID, targetCompID );

    Sessions::iterator i = m_sessions.find( sessionID );
    if ( i != m_sessions.end() )
    {
      i->second->setResponder( &responder );
      return i->second;
    }
  }
  catch ( FieldNotFound& ) {}
  return 0;
}